

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpudpv6transmitter.cpp
# Opt level: O2

void __thiscall jrtplib::RTPUDPv6Transmitter::AddLoopbackAddress(RTPUDPv6Transmitter *this)

{
  bool bVar1;
  list<in6_addr,_std::allocator<in6_addr>_> *this_00;
  _List_node_base *p_Var2;
  
  this_00 = &this->localIPs;
  bVar1 = false;
  p_Var2 = (_List_node_base *)this_00;
  while( true ) {
    if (bVar1 != false) {
      return;
    }
    p_Var2 = (((_List_base<in6_addr,_std::allocator<in6_addr>_> *)&p_Var2->_M_next)->_M_impl).
             _M_node.super__List_node_base._M_next;
    if (p_Var2 == (_List_node_base *)this_00) break;
    bVar1 = operator==((in6_addr *)(p_Var2 + 1),(in6_addr *)&in6addr_loopback);
  }
  std::__cxx11::list<in6_addr,_std::allocator<in6_addr>_>::push_back
            (this_00,(value_type *)&in6addr_loopback);
  return;
}

Assistant:

void RTPUDPv6Transmitter::AddLoopbackAddress()
{
	std::list<in6_addr>::const_iterator it;
	bool found = false;

	for (it = localIPs.begin() ; !found && it != localIPs.end() ; it++)
	{
		if ((*it) == in6addr_loopback)
			found = true;
	}

	if (!found)
		localIPs.push_back(in6addr_loopback);
}